

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unix.h
# Opt level: O2

bool MakeErrMsg(string *ErrMsg,string *prefix,int errnum)

{
  undefined1 in_AL;
  uint *puVar1;
  int errnum_00;
  string sStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (ErrMsg != (string *)0x0) {
    if (errnum == -1) {
      puVar1 = (uint *)__errno_location();
      errnum = *puVar1;
    }
    std::operator+(&local_68,prefix,": ");
    llvm::sys::StrError_abi_cxx11_(&sStack_88,(sys *)(ulong)(uint)errnum,errnum_00);
    std::operator+(&local_48,&local_68,&sStack_88);
    std::__cxx11::string::operator=((string *)ErrMsg,(string *)&local_48);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    in_AL = std::__cxx11::string::_M_dispose();
  }
  return (bool)in_AL;
}

Assistant:

static inline bool MakeErrMsg(
  std::string* ErrMsg, const std::string& prefix, int errnum = -1) {
  if (!ErrMsg)
    return true;
  if (errnum == -1)
    errnum = errno;
  *ErrMsg = prefix + ": " + llvm::sys::StrError(errnum);
  return true;
}